

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

reference __thiscall
andres::View<int,false,std::allocator<unsigned_long>>::operator()
          (View<int,false,std::allocator<unsigned_long>> *this,size_t value,unsigned_long args)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 local_21;
  unsigned_long args_local;
  size_t value_local;
  View<int,_false,_std::allocator<unsigned_long>_> *this_local;
  
  View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
  local_21 = false;
  if (*(long *)this != 0) {
    sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::dimension
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)this);
    local_21 = sVar2 == 2;
  }
  marray_detail::Assert<bool>(local_21);
  lVar1 = *(long *)this;
  sVar2 = View<int,_false,_std::allocator<unsigned_long>_>::strides
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this,0);
  sVar3 = View<int,_false,_std::allocator<unsigned_long>_>::elementAccessHelper
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)this,2,args);
  return (reference)(lVar1 + (sVar2 * value + sVar3) * 4);
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value, 
    const Args... args
) const
{
    testInvariant();
    marray_detail::Assert( MARRAY_NO_DEBUG || ( data_ != 0 && sizeof...(args)+1 == dimension() ) );
    return data_[ strides(0) * static_cast<std::size_t>(value) 
        + static_cast<std::size_t>(elementAccessHelper(sizeof...(args)+1, args...)) ];
}